

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

void __thiscall gui::MenuBar::updateMenuBar(MenuBar *this)

{
  float fVar1;
  bool bVar2;
  element_type *peVar3;
  reference pMVar4;
  long in_RDI;
  Vector2f VVar5;
  FloatRect FVar6;
  FloatRect bounds;
  MenuList *menu;
  iterator __end1;
  iterator __begin1;
  vector<gui::MenuList,_std::allocator<gui::MenuList>_> *__range1;
  Vector2f lastLabelPosition;
  Vector2f in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  float X;
  float local_50;
  float local_48;
  __normal_iterator<gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
  local_20;
  long local_18;
  Vector2<float> local_10 [2];
  
  peVar3 = std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19accf);
  X = (peVar3->barTextPadding_).x;
  peVar3 = std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19acee);
  sf::Vector2<float>::Vector2(local_10,X,(peVar3->barTextPadding_).y);
  local_18 = in_RDI + 0x2e0;
  local_20._M_current =
       (MenuList *)
       std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::begin
                 ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)in_stack_ffffffffffffff98
                 );
  std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::end
            ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
                        *)CONCAT44(X,in_stack_ffffffffffffffa0),
                       (__normal_iterator<gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar2) break;
    pMVar4 = __gnu_cxx::
             __normal_iterator<gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
             ::operator*(&local_20);
    VVar5 = anon_unknown.dwarf_f5298::roundVector2f(in_stack_ffffffffffffff98);
    pMVar4->labelPosition_ = VVar5;
    in_stack_ffffffffffffff98 = (Vector2f)(in_RDI + 0x2c0);
    std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19ad99);
    sf::Text::setString((Text *)CONCAT44(X,in_stack_ffffffffffffffa0),
                        (String *)in_stack_ffffffffffffff98);
    std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19adb6);
    FVar6 = sf::Text::getLocalBounds((Text *)in_stack_ffffffffffffff98);
    local_50 = FVar6.left;
    local_48 = FVar6.width;
    pMVar4->labelWidth_ = local_50 + local_48;
    peVar3 = std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19adf8);
    fVar1 = (peVar3->barTextPadding_).x;
    local_10[0].x = fVar1 + fVar1 + pMVar4->labelWidth_ + local_10[0].x;
    __gnu_cxx::
    __normal_iterator<gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
    ::operator++(&local_20);
  }
  Widget::requestRedraw((Widget *)CONCAT44(X,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

void MenuBar::updateMenuBar() {
    sf::Vector2f lastLabelPosition(style_->barTextPadding_.x, style_->barTextPadding_.y);
    for (auto& menu : menus_) {
        menu.labelPosition_ = roundVector2f(lastLabelPosition);
        style_->text_.setString(menu.name);
        const auto bounds = style_->text_.getLocalBounds();
        menu.labelWidth_ = bounds.left + bounds.width;
        lastLabelPosition.x += 2.0f * style_->barTextPadding_.x + menu.labelWidth_;
    }
    requestRedraw();
}